

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyResyn.c
# Opt level: O0

Ivy_Man_t * Ivy_ManResyn(Ivy_Man_t *pMan,int fUpdateLevel,int fVerbose)

{
  abctime aVar1;
  Ivy_Man_t *pIVar2;
  abctime aVar3;
  Ivy_Man_t *pIVar4;
  Ivy_Man_t *pTemp;
  abctime clk;
  int fVerbose_local;
  int fUpdateLevel_local;
  Ivy_Man_t *pMan_local;
  
  if (fVerbose != 0) {
    printf("Original:\n");
    Ivy_ManPrintStats(pMan);
  }
  aVar1 = Abc_Clock();
  pIVar2 = Ivy_ManBalance(pMan,fUpdateLevel);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Balance");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  aVar1 = Abc_Clock();
  Ivy_ManRewritePre(pIVar2,fUpdateLevel,0,0);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Rewrite");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  aVar1 = Abc_Clock();
  pIVar4 = Ivy_ManBalance(pIVar2,fUpdateLevel);
  Ivy_ManStop(pIVar2);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Balance");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(pIVar4);
  }
  aVar1 = Abc_Clock();
  Ivy_ManRewritePre(pIVar4,fUpdateLevel,1,0);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Rewrite");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(pIVar4);
  }
  aVar1 = Abc_Clock();
  pIVar2 = Ivy_ManBalance(pIVar4,fUpdateLevel);
  Ivy_ManStop(pIVar4);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Balance");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  aVar1 = Abc_Clock();
  Ivy_ManRewritePre(pIVar2,fUpdateLevel,1,0);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Rewrite");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(pIVar2);
  }
  aVar1 = Abc_Clock();
  pIVar4 = Ivy_ManBalance(pIVar2,fUpdateLevel);
  Ivy_ManStop(pIVar2);
  if (fVerbose != 0) {
    printf("\n");
    Abc_Print(1,"%s =","Balance");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar1) * 1.0) / 1000000.0);
    Ivy_ManPrintStats(pIVar4);
  }
  return pIVar4;
}

Assistant:

Ivy_Man_t * Ivy_ManResyn( Ivy_Man_t * pMan, int fUpdateLevel, int fVerbose )
{
    abctime clk;
    Ivy_Man_t * pTemp;

if ( fVerbose ) { printf( "Original:\n" ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pMan, fUpdateLevel );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 0 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 1 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 1, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 1 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 1, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );
    return pMan;
}